

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_concat(FuncState *fs,int *l1,int l2)

{
  int pc;
  int iVar1;
  
  if (l2 != -1) {
    iVar1 = *l1;
    if (*l1 != -1) {
      do {
        pc = iVar1;
        iVar1 = getjump(fs,pc);
      } while (iVar1 != -1);
      fixjump(fs,pc,l2);
      return;
    }
    *l1 = l2;
  }
  return;
}

Assistant:

void luaK_concat (FuncState *fs, int *l1, int l2) {
  if (l2 == NO_JUMP) return;
  else if (*l1 == NO_JUMP)
    *l1 = l2;
  else {
    int list = *l1;
    int next;
    while ((next = getjump(fs, list)) != NO_JUMP)  /* find last element */
      list = next;
    fixjump(fs, list, l2);
  }
}